

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

void __thiscall o3dgc::CompressedTriangleFans::CompressedTriangleFans(CompressedTriangleFans *this)

{
  CompressedTriangleFans *this_local;
  
  Vector<long>::Vector(&this->m_numTFANs);
  Vector<long>::Vector(&this->m_degrees);
  Vector<long>::Vector(&this->m_configs);
  Vector<long>::Vector(&this->m_operations);
  Vector<long>::Vector(&this->m_indices);
  Vector<long>::Vector(&this->m_trianglesOrder);
  this->m_streamType = O3DGC_STREAM_TYPE_UNKOWN;
  this->m_bufferAC = (uchar *)0x0;
  this->m_sizeBufferAC = 0;
  return;
}

Assistant:

CompressedTriangleFans(void)
                                    {
                                        m_streamType   = O3DGC_STREAM_TYPE_UNKOWN;
                                        m_bufferAC     = 0;
                                        m_sizeBufferAC = 0;
                                    }